

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_default_vfs_write
                    (ma_vfs *pVFS,ma_vfs_file file,void *pSrc,size_t sizeInBytes,
                    size_t *pBytesWritten)

{
  int e;
  ma_result mVar1;
  size_t sVar2;
  
  if (pBytesWritten != (size_t *)0x0) {
    *pBytesWritten = 0;
  }
  mVar1 = MA_INVALID_ARGS;
  if (pSrc != (void *)0x0 && file != (ma_vfs_file)0x0) {
    sVar2 = fwrite(pSrc,1,sizeInBytes,(FILE *)file);
    if (pBytesWritten != (size_t *)0x0) {
      *pBytesWritten = sVar2;
    }
    mVar1 = MA_SUCCESS;
    if (sVar2 != sizeInBytes) {
      e = ferror((FILE *)file);
      mVar1 = ma_result_from_errno(e);
      return mVar1;
    }
  }
  return mVar1;
}

Assistant:

static ma_result ma_default_vfs_write(ma_vfs* pVFS, ma_vfs_file file, const void* pSrc, size_t sizeInBytes, size_t* pBytesWritten)
{
    if (pBytesWritten != NULL) {
        *pBytesWritten = 0;
    }

    if (file == NULL || pSrc == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_write__win32(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
#else
    return ma_default_vfs_write__stdio(pVFS, file, pSrc, sizeInBytes, pBytesWritten);
#endif
}